

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_tests.cpp
# Opt level: O1

void __thiscall
compress_tests::compress_script_to_ckey_id::test_method(compress_script_to_ckey_id *this)

{
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  undefined4 uVar4;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_00;
  undefined8 uVar5;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  undefined8 uVar9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  size_type local_1dc;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  assertion_result local_1b8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  bool done;
  undefined1 local_174 [20];
  char *local_160;
  char *local_158;
  CKey key;
  size_type *local_140;
  CompressedScript *local_138;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_130;
  CompressedScript **local_118;
  size_type **local_110;
  char *local_108;
  assertion_result local_100;
  CompressedScript out;
  CScript script;
  CPubKey pubkey;
  undefined1 local_58 [20];
  uchar auStack_44 [4];
  size_type **local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey(SUB81(&key,0));
  CKey::GetPubKey(&pubkey,&key);
  out._union._16_8_ = 0;
  out._union._24_8_ = 0;
  out._union.indirect_contents.indirect = (char *)0x0;
  out._union._8_8_ = 0;
  local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = (vector<unsigned_char,std::allocator<unsigned_char>>)0x76
  ;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&out,(iterator)&out,
             (uchar *)&local_130);
  uVar5 = out._union.indirect_contents.indirect;
  uVar4 = out._union._28_4_ + -0x1d;
  if ((uint)out._union._28_4_ < 0x1d) {
    uVar5 = &out;
    uVar4 = out._union._28_4_;
  }
  local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,0xa9);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&out,
             (uchar *)((long)&((CompressedScript *)uVar5)->_union + (long)(int)uVar4),
             (uchar *)&local_130);
  CPubKey::GetID((CKeyID *)local_58,&pubkey);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_130,local_58,auStack_44,
             (allocator_type *)&local_1b8);
  this_00 = &CScript::operator<<((CScript *)&out,&local_130)->super_CScriptBase;
  uVar1 = this_00->_size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (this_00->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar6 = this_00;
  }
  local_1b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x88;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this_00,(uchar *)((long)&ppVar6->_union + (long)(int)uVar2),(uchar *)&local_1b8);
  uVar1 = this_00->_size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (this_00->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar6 = this_00;
  }
  local_1b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this_00,(uchar *)((long)&ppVar6->_union + (long)(int)uVar2),(uchar *)&local_1b8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(&script.super_CScriptBase,this_00);
  if (local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_130.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (0x1c < (uint)out._union._28_4_) {
    free(out._union.indirect_contents.indirect);
    out._union.indirect_contents.indirect = (char *)0x0;
  }
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_158 = "";
  local_174._4_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_174._12_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x49;
  file.m_begin = (iterator)&local_160;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)(local_174 + 4),msg
            );
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013d3cb0;
  stack0xffffffffffffffb8 = boost::unit_test::lazy_ostream::inst;
  sVar3 = script.super_CScriptBase._size - 0x1d;
  if (script.super_CScriptBase._size < 0x1d) {
    sVar3 = script.super_CScriptBase._size;
  }
  local_40 = (size_type **)0xf98c4c;
  local_110 = &local_140;
  local_140 = (size_type *)CONCAT44(local_140._4_4_,sVar3);
  local_1b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(sVar3 == 0x19);
  local_138 = (CompressedScript *)local_174;
  local_174._0_4_ = 0x19;
  local_1b8.m_message.px = (element_type *)0x0;
  local_1b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_100.m_message.px = (element_type *)0xe9a972;
  out._union._24_8_ = &local_110;
  out._union._8_8_ = out._union._8_8_ & 0xffffffffffffff00;
  out._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013d3d30;
  out._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_118 = &local_138;
  local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3d30;
  local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b8,(lazy_ostream *)local_58,1,2,REQUIRE,0xe9aa89,(size_t)&local_100,0x49,&out,
             "25U",&local_130);
  boost::detail::shared_count::~shared_count(&local_1b8.m_message.pn);
  out._union._16_8_ = 0;
  out._union._24_8_ = 0;
  out._union.indirect_contents.indirect = (char *)0x0;
  out._union._8_8_ = 0;
  out._union.direct[0x20] = '\0';
  out._size = 0;
  done = CompressScript(&script,&out);
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4d;
  file_00.m_begin = (iterator)&local_188;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_198,
             msg_00);
  local_1b8.m_message.px = (element_type *)((ulong)local_1b8.m_message.px & 0xffffffffffffff00);
  local_1b8._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_1b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1a0 = "";
  local_174[0] = 1;
  local_138 = (CompressedScript *)&done;
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)done;
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = (size_type **)0xe9a912;
  local_108 = "";
  local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d4010;
  local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_118 = &local_138;
  local_140 = (size_type *)local_174;
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013d4010;
  stack0xffffffffffffffb8 = boost::unit_test::lazy_ostream::inst;
  local_40 = &local_140;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)&local_1b8,1,2,REQUIRE,0xfeb143,(size_t)&local_110,0x4d,
             &local_130,"true",local_58);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = &DAT_00000050;
  file_01.m_begin = (iterator)&local_1c8;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1d8,
             msg_01);
  local_1b8.m_message.px = (element_type *)((ulong)local_1b8.m_message.px & 0xffffffffffffff00);
  local_1b8._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_1b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_174._0_4_ = out._size - 0x22;
  if (out._size < 0x22) {
    local_174._0_4_ = out._size;
  }
  local_1a0 = "";
  local_140 = &local_1dc;
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_174._0_4_ == 0x15);
  local_1dc = 0x15;
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = (size_type **)0xe9a912;
  local_108 = "";
  local_138 = (CompressedScript *)local_174;
  local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3d30;
  local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_118 = &local_138;
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013d3d30;
  stack0xffffffffffffffb8 = boost::unit_test::lazy_ostream::inst;
  local_40 = &local_140;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)&local_1b8,1,2,REQUIRE,0xfadf88,(size_t)&local_110,0x50,
             &local_130,"21U",local_58);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x51;
  file_02.m_begin = (iterator)&local_1f0;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_200,
             msg_02);
  local_1b8.m_message.px = (element_type *)((ulong)local_1b8.m_message.px & 0xffffffffffffff00);
  local_1b8._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_1b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1a0 = "";
  local_138 = &out;
  if (0x21 < out._size) {
    local_138 = (CompressedScript *)out._union.indirect_contents.indirect;
  }
  local_174._0_4_ = 0;
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((local_138->_union).direct[0] == '\0');
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = (size_type **)0xe9a912;
  local_108 = "";
  local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d4aa0;
  local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_118 = &local_138;
  local_140 = (size_type *)local_174;
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013d3e70;
  stack0xffffffffffffffb8 = boost::unit_test::lazy_ostream::inst;
  local_40 = &local_140;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)&local_1b8,1,2,REQUIRE,0xf6e480,(size_t)&local_110,0x51,
             &local_130,"0x00",local_58);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x52;
  file_03.m_begin = (iterator)&local_210;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_220,
             msg_03);
  local_1b8.m_message.px = (element_type *)((ulong)local_1b8.m_message.px & 0xffffffffffffff00);
  local_1b8._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_1b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1a0 = "";
  uVar5 = out._union.indirect_contents.indirect;
  if (out._size < 0x22) {
    uVar5 = &out;
  }
  uVar9 = &script;
  if (0x1c < script.super_CScriptBase._size) {
    uVar9 = script.super_CScriptBase._union.indirect_contents.indirect;
  }
  local_174._0_4_ =
       memcmp((void *)((long)&((CompressedScript *)uVar5)->_union + 1),
              (void *)((long)&(((CScript *)uVar9)->super_CScriptBase)._union + 3),0x14);
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_174._0_4_ == 0);
  local_1dc = 0;
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = (size_type **)0xe9a912;
  local_108 = "";
  local_138 = (CompressedScript *)local_174;
  local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3e70;
  local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_118 = &local_138;
  local_140 = &local_1dc;
  local_58[8] = false;
  local_58._0_8_ = &PTR__lazy_ostream_013d3e70;
  stack0xffffffffffffffb8 = boost::unit_test::lazy_ostream::inst;
  local_40 = &local_140;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,(lazy_ostream *)&local_1b8,1,2,REQUIRE,0xe9aa9b,(size_t)&local_110,0x52,
             &local_130,"0",local_58);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  if (0x21 < out._size) {
    free(out._union.indirect_contents.indirect);
    out._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x1c < script.super_CScriptBase._size) {
    free(script.super_CScriptBase._union.indirect_contents.indirect);
    script.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if ((__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )key.keydata._M_t.
        super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&key.keydata,
               (array<unsigned_char,_32UL> *)
               key.keydata._M_t.
               super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(compress_script_to_ckey_id)
{
    // case CKeyID
    CKey key = GenerateRandomKey();
    CPubKey pubkey = key.GetPubKey();

    CScript script = CScript() << OP_DUP << OP_HASH160 << ToByteVector(pubkey.GetID()) << OP_EQUALVERIFY << OP_CHECKSIG;
    BOOST_CHECK_EQUAL(script.size(), 25U);

    CompressedScript out;
    bool done = CompressScript(script, out);
    BOOST_CHECK_EQUAL(done, true);

    // Check compressed script
    BOOST_CHECK_EQUAL(out.size(), 21U);
    BOOST_CHECK_EQUAL(out[0], 0x00);
    BOOST_CHECK_EQUAL(memcmp(out.data() + 1, script.data() + 3, 20), 0); // compare the 20 relevant chars of the CKeyId in the script
}